

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

int ON_ArePointsOnPlane(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                       ON_Plane *plane,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  char *sFormat;
  uint i;
  uint i_00;
  int iVar4;
  uint i_01;
  double dVar5;
  double local_98;
  int local_8c;
  ON_3dPoint Q;
  double *local_60;
  ON_3dPoint local_48;
  
  if (0 < count) {
    bVar1 = ON_Plane::IsValid(plane);
    if (bVar1) {
      bVar1 = ON_BoundingBox::IsValid(bbox);
      if (bVar1) {
        bVar1 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar1) {
          sFormat = "tolerance must be >= 0.0";
          iVar4 = 0x232;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim must be 2 or 3";
          iVar4 = 0x237;
        }
        else if (stride < (int)((uint)is_rat + dim)) {
          sFormat = "stride parameter is too small";
          iVar4 = 0x23c;
        }
        else if (point == (double *)0x0) {
          sFormat = "point parameter is null";
          iVar4 = 0x241;
        }
        else {
          local_98 = tolerance;
          if ((tolerance == 0.0) && (!NAN(tolerance))) {
            local_98 = ON_BoundingBox::Tolerance(bbox);
          }
          if (count == 1) {
            iVar4 = 2;
          }
          else {
            ON_BoundingBox::Diagonal((ON_3dVector *)&Q,bbox);
            dVar5 = ON_3dVector::Length((ON_3dVector *)&Q);
            iVar4 = 2 - (uint)(local_98 < dVar5);
          }
          for (i_00 = 0; (iVar4 != 0 && (i_00 < 2)); i_00 = i_00 + 1) {
            pOVar3 = ON_BoundingBox::operator[](bbox,i_00);
            Q.x = pOVar3->x;
            for (i = 0; (iVar4 != 0 && (i < 2)); i = i + 1) {
              pOVar3 = ON_BoundingBox::operator[](bbox,i);
              Q.y = pOVar3->y;
              for (i_01 = 0; (iVar4 != 0 && (i_01 < 2)); i_01 = i_01 + 1) {
                pOVar3 = ON_BoundingBox::operator[](bbox,i_01);
                Q.z = pOVar3->z;
                p.y = Q.y;
                p.x = Q.x;
                p.z = Q.z;
                ON_Plane::ClosestPointTo(&local_48,plane,p);
                dVar5 = ON_3dPoint::DistanceTo(&Q,&local_48);
                iVar2 = 0;
                if (dVar5 <= local_98) {
                  iVar2 = iVar4;
                }
                iVar4 = iVar2;
              }
            }
          }
          if (iVar4 != 0) {
            return iVar4;
          }
          Q.z = ON_3dPoint::Origin.z;
          Q.x = ON_3dPoint::Origin.x;
          Q.y = ON_3dPoint::Origin.y;
          if (count == 1) {
            iVar4 = 2;
          }
          else {
            ON_BoundingBox::Diagonal((ON_3dVector *)&local_48,bbox);
            dVar5 = ON_3dVector::Length((ON_3dVector *)&local_48);
            iVar4 = 2 - (uint)(local_98 < dVar5);
          }
          local_8c = count;
          if (!is_rat) {
            while( true ) {
              bVar1 = local_8c == 0;
              local_8c = local_8c + -1;
              if (bVar1) {
                return iVar4;
              }
              memcpy(&Q,point,(ulong)(uint)(dim << 3));
              p_01.y = Q.y;
              p_01.x = Q.x;
              p_01.z = Q.z;
              ON_Plane::ClosestPointTo(&local_48,plane,p_01);
              dVar5 = ON_3dPoint::DistanceTo(&Q,&local_48);
              if (local_98 < dVar5) break;
              point = point + (uint)stride;
            }
            return 0;
          }
          local_60 = point;
          while( true ) {
            bVar1 = local_8c == 0;
            local_8c = local_8c + -1;
            if (bVar1) {
              return iVar4;
            }
            dVar5 = local_60[(uint)dim];
            if ((dVar5 == 0.0) && (!NAN(dVar5))) break;
            ON_ArrayScale(dim,1.0 / dVar5,local_60,&Q.x);
            p_00.y = Q.y;
            p_00.x = Q.x;
            p_00.z = Q.z;
            ON_Plane::ClosestPointTo(&local_48,plane,p_00);
            dVar5 = ON_3dPoint::DistanceTo(&Q,&local_48);
            if (local_98 < dVar5) {
              return 0;
            }
            local_60 = local_60 + (uint)stride;
          }
          sFormat = "rational point has zero weight";
          iVar4 = 0x263;
        }
      }
      else {
        sFormat = "bbox parameter is not valid";
        iVar4 = 0x22d;
      }
    }
    else {
      sFormat = "plane parameter is not valid";
      iVar4 = 0x228;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
               ,iVar4,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnPlane( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Plane& plane,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;
  if ( !plane.IsValid() )
  {
    ON_ERROR("plane parameter is not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter is not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance must be >= 0.0");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim must be 2 or 3");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter is too small");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter is null");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q;

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}